

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

BadNameString * CLI::BadNameString::ReservedName(BadNameString *__return_storage_ptr__,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,
                   "Names \'-\',\'--\',\'++\' are reserved and not allowed as option names ",name);
  BadNameString(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static BadNameString ReservedName(std::string name) {
        return BadNameString("Names '-','--','++' are reserved and not allowed as option names " + name);
    }